

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
* __thiscall
Graph::random_two_bridges_search
          (vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
           *__return_storage_ptr__,Graph *this,bool recursive)

{
  undefined7 in_register_00000011;
  pointer pEVar1;
  pointer __args;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> copy;
  Bridges bridges;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_60;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clear(this);
  if ((int)CONCAT71(in_register_00000011,recursive) == 0) {
    dfsForRandomIterative(this);
  }
  else {
    dfsForRandomRecursive(this,0);
  }
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector(&local_60,&this->edges);
  srs::radixSort(&local_60);
  if (local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __args = local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_48 = (void *)0x0;
      uStack_40 = 0;
      local_38 = 0;
      do {
        pEVar1 = __args;
        if (pEVar1 + 1 ==
            local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00103785;
        __args = pEVar1 + 1;
      } while (pEVar1->shift != pEVar1[1].shift);
      __args = pEVar1;
      if (pEVar1 != local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if (__args->shift != pEVar1->shift) break;
          std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&local_48,
                     (unsigned_long *)__args,&(__args->super_LightEdge).v);
          __args = __args + 1;
        } while (__args != local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_48);
      if (local_48 != (void *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
    } while (__args != local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
LAB_00103785:
  if (local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Graph::Bridges> Graph::random_two_bridges_search(bool recursive) {
    std::vector<Graph::Bridges> out;
    clear();

    if (recursive)
        dfsForRandomRecursive(0);
    else
        dfsForRandomIterative();

    auto copy = edges;
    srs::radixSort(copy);

    for (auto it = copy.begin(), jt = it; it != copy.end(); jt = it) {
        Graph::Bridges bridges;

        jt = it = std::adjacent_find(jt, copy.end());

        if (jt == copy.end())
            break;

        while (it != copy.end() && *it == *jt) {
            bridges.emplace_back(it->u, it->v);
            ++it;
        }

        out.push_back(bridges);
    }

    return out;
}